

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook.c
# Opt level: O1

_Bool * hook_reentrantp(void)

{
  tsd_t *tsd;
  _Bool *p_Var1;
  
  if (duckdb_je_tsd_booted) {
    tsd = (tsd_t *)__tls_get_addr(&PTR_024d8b58);
    if ((tsd->state).repr != '\0') {
      tsd = duckdb_je_tsd_fetch_slow(tsd,false);
    }
  }
  else {
    tsd = (tsd_t *)0x0;
  }
  p_Var1 = &hook_reentrantp::in_hook_global;
  if (tsd != (tsd_t *)0x0) {
    p_Var1 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_in_hook;
  }
  return p_Var1;
}

Assistant:

static bool *
hook_reentrantp(void) {
	/*
	 * We prevent user reentrancy within hooks.  This is basically just a
	 * thread-local bool that triggers an early-exit.
	 *
	 * We don't fold in_hook into reentrancy.  There are two reasons for
	 * this:
	 * - Right now, we turn on reentrancy during things like extent hook
	 *   execution.  Allocating during extent hooks is not officially
	 *   supported, but we don't want to break it for the time being.  These
	 *   sorts of allocations should probably still be hooked, though.
	 * - If a hook allocates, we may want it to be relatively fast (after
	 *   all, it executes on every allocator operation).  Turning on
	 *   reentrancy is a fairly heavyweight mode (disabling tcache,
	 *   redirecting to arena 0, etc.).  It's possible we may one day want
	 *   to turn on reentrant mode here, if it proves too difficult to keep
	 *   this working.  But that's fairly easy for us to see; OTOH, people
	 *   not using hooks because they're too slow is easy for us to miss.
	 *
	 * The tricky part is
	 * that this code might get invoked even if we don't have access to tsd.
	 * This function mimics getting a pointer to thread-local data, except
	 * that it might secretly return a pointer to some global data if we
	 * know that the caller will take the early-exit path.
	 * If we return a bool that indicates that we are reentrant, then the
	 * caller will go down the early exit path, leaving the global
	 * untouched.
	 */
	static bool in_hook_global = true;
	tsdn_t *tsdn = tsdn_fetch();
	bool *in_hook = tsdn_in_hookp_get(tsdn);
	if (in_hook!= NULL) {
		return in_hook;
	}
	return &in_hook_global;
}